

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTimerPre.h
# Opt level: O2

void __thiscall HTimerPre::reset(HTimerPre *this)

{
  undefined8 uVar1;
  undefined1 auVar2 [12];
  int i;
  long lVar3;
  undefined4 uVar4;
  double dVar5;
  undefined1 auVar6 [16];
  
  for (lVar3 = 0; lVar3 != 0xe; lVar3 = lVar3 + 1) {
    this->itemTicks[lVar3] = 0.0;
  }
  dVar5 = getWallTime(this);
  this->startTime = dVar5;
  uVar1 = rdtsc();
  uVar4 = (undefined4)((ulong)uVar1 >> 0x20);
  auVar2._4_4_ = uVar4;
  auVar2._0_4_ = uVar4;
  auVar2._8_4_ = 0;
  auVar6._0_12_ = auVar2 << 0x20;
  auVar6._12_4_ = 0x45300000;
  this->startTick =
       (auVar6._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0);
  return;
}

Assistant:

void reset() {
        for (int i = 0; i < HTICK_ITEMS_COUNT_PRE; i++)
            itemTicks[i] = 0;
        startTime = getWallTime();
        startTick = getWallTick();
    }